

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

void ScanPair(ConfigScanner *sc)

{
  _Bool _Var1;
  char *pcVar2;
  
  if (sc != (ConfigScanner *)0x0) {
    pcVar2 = sc->ptr;
    while( true ) {
      if ((*pcVar2 != ' ') && (*pcVar2 != '\t')) break;
      sc->ptr = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    }
    _Var1 = GetKeyWord(sc);
    if (_Var1) {
      pcVar2 = sc->ptr;
      while( true ) {
        if ((*pcVar2 != ' ') && (*pcVar2 != '\t')) break;
        sc->ptr = pcVar2 + 1;
        pcVar2 = pcVar2 + 1;
      }
      pcVar2 = sc->ptr;
      if (*pcVar2 == '=') {
        sc->ptr = pcVar2 + 1;
        for (pcVar2 = pcVar2 + 2; (pcVar2[-1] == ' ' || (pcVar2[-1] == '\t')); pcVar2 = pcVar2 + 1)
        {
          sc->ptr = pcVar2;
        }
        ScanValue(sc);
        return;
      }
    }
  }
  return;
}

Assistant:

void ScanPair(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	SkipSpace(sc);
	if (!GetKeyWord(sc))
	{
		return;
	}
	SkipSpace(sc);
	if (!GetEQ(sc))
	{
		return;
	}
	SkipSpace(sc);
	if (!ScanValue(sc))
	{
		return;
	}
	return;
}